

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_stack.hpp
# Opt level: O1

void __thiscall asio::detail::scheduler::capture_current_exception(scheduler *this)

{
  long lVar1;
  undefined8 uVar2;
  long *plVar3;
  long lVar4;
  long in_FS_OFFSET;
  multiple_exceptions mStack_40;
  undefined **ppuStack_30;
  long lStack_28;
  
  plVar3 = *(long **)(in_FS_OFFSET + -0x10);
  if (plVar3 == (long *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = 0;
    do {
      if ((scheduler *)*plVar3 == this) {
        lVar4 = plVar3[1];
        break;
      }
      plVar3 = (long *)plVar3[2];
    } while (plVar3 != (long *)0x0);
  }
  if (lVar4 == 0) {
    return;
  }
  if (*(int *)(lVar4 + 0x50) == 1) {
    *(undefined4 *)(lVar4 + 0x50) = 2;
    lVar1 = *(long *)(lVar4 + 0x58);
    if (lVar1 != 0) {
      std::__exception_ptr::exception_ptr::_M_addref();
    }
    ppuStack_30 = &PTR__multiple_exceptions_00157d30;
    lStack_28 = lVar1;
    std::make_exception_ptr<asio::multiple_exceptions>(&mStack_40);
    uVar2 = mStack_40._0_8_;
    mStack_40._0_8_ = 0;
    mStack_40.first_._M_exception_object = *(void **)(lVar4 + 0x58);
    *(undefined8 *)(lVar4 + 0x58) = uVar2;
    if (mStack_40.first_._M_exception_object != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    if (mStack_40._0_8_ != 0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    ppuStack_30 = &PTR__multiple_exceptions_00157d30;
    if (lStack_28 != 0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    std::exception::~exception((exception *)&ppuStack_30);
  }
  else if (*(int *)(lVar4 + 0x50) == 0) {
    *(undefined4 *)(lVar4 + 0x50) = 1;
    std::current_exception();
    uVar2 = mStack_40._0_8_;
    mStack_40._0_8_ = 0;
    mStack_40.first_._M_exception_object = *(void **)(lVar4 + 0x58);
    *(undefined8 *)(lVar4 + 0x58) = uVar2;
    if (mStack_40.first_._M_exception_object != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    if (mStack_40._0_8_ != 0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
  }
  return;
}

Assistant:

static Value* contains(Key* k)
  {
    context* elem = top_;
    while (elem)
    {
      if (elem->key_ == k)
        return elem->value_;
      elem = elem->next_;
    }
    return 0;
  }